

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swap_qlook.c
# Opt level: O1

void swap_crispen(float *out,size_t w,size_t h)

{
  float *b;
  long lVar1;
  int h_00;
  int w_00;
  long lVar2;
  
  lVar2 = h * w;
  b = (float *)g_malloc(lVar2 * 0xc);
  w_00 = (int)w;
  h_00 = (int)h;
  swap_gauss(out,b,w_00,h_00,0.5);
  if (lVar2 != 0) {
    memcpy(out,b,lVar2 * 4);
  }
  swap_gauss(out,b,w_00,h_00,0.625);
  swap_gauss(out,b + lVar2,w_00,h_00,1.0);
  swap_gauss(out,b + lVar2 * 2,w_00,h_00,2.0);
  if (lVar2 != 0) {
    lVar1 = 0;
    do {
      out[lVar1] = (b + lVar2 * 2)[lVar1] * -0.5 + out[lVar1] +
                   (b[lVar1] * 1.5 - (b + lVar2)[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar2 - lVar1 != 0);
  }
  g_free(b);
  return;
}

Assistant:

void swap_crispen(float *out, size_t w, size_t h) {
    size_t i, l = w * h;
    float *in = (float *) g_malloc(3 * l * sizeof *in);

    /* apply first a slight blur to reduce pixel scale artifacts */
    swap_gauss(out, in + 0 * l, w, h, .5);
    for (i = 0; i < l; ++i)
        out[i] += BLUR * (in[i + 0 * l] - out[i]);

    swap_gauss(out, in + 0 * l, w, h, SIGMA);
    swap_gauss(out, in + 1 * l, w, h, SIGMA * 1.6);
    swap_gauss(out, in + 2 * l, w, h, SIGMA * 3.2);

    /* DoG narrow & wide */
    for (i = 0; i < l; ++i)
        out[i] += (NARROW + WIDE) * in[i + 0 * l]
            - NARROW * in[i + l] - WIDE * in[i + 2 * l];

    g_free(in);
}